

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int local_24;
  int subset;
  int ret;
  int a;
  int i;
  char **argv_local;
  int argc_local;
  
  bVar1 = false;
  fillFilling();
  initializeLibxml2();
  for (subset = 1; subset < argc; subset = subset + 1) {
    iVar2 = strcmp(argv[subset],"-v");
    if (iVar2 == 0) {
      verbose = 1;
    }
    else {
      iVar2 = strcmp(argv[subset],"-quiet");
      if (iVar2 == 0) {
        tests_quiet = 1;
      }
      else {
        iVar2 = strcmp(argv[subset],"-crazy");
        if (iVar2 == 0) {
          bVar1 = true;
        }
      }
    }
  }
  if (!bVar1) {
    ret = 0;
    while (testDescriptions[ret].func != (functest)0x0) {
      runtest(ret);
      ret = ret + 1;
    }
  }
  runcrazy();
  if ((nb_errors == 0) && (nb_leaks == 0)) {
    local_24 = 0;
    printf("Total %d tests, no errors\n",(ulong)(uint)nb_tests);
  }
  else {
    local_24 = 1;
    printf("Total %d tests, %d errors, %d leaks\n",(ulong)(uint)nb_tests,(ulong)(uint)nb_errors,
           (ulong)(uint)nb_leaks);
  }
  xmlCleanupParser();
  xmlMemoryDump();
  return local_24;
}

Assistant:

int
main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    int i, a, ret = 0;
    int subset = 0;

    fillFilling();
    initializeLibxml2();

    for (a = 1; a < argc;a++) {
        if (!strcmp(argv[a], "-v"))
	    verbose = 1;
        else if (!strcmp(argv[a], "-quiet"))
	    tests_quiet = 1;
        else if (!strcmp(argv[a], "-crazy"))
	    subset = 1;
    }
    if (subset == 0) {
	for (i = 0; testDescriptions[i].func != NULL; i++) {
	    ret += runtest(i);
	}
    }
    ret += runcrazy();
    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
        ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
    }
    xmlCleanupParser();
    xmlMemoryDump();

    return(ret);
}